

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::ReturnCallIndirectExpr::ReturnCallIndirectExpr(ReturnCallIndirectExpr *this,Location *loc)

{
  Location *loc_local;
  ReturnCallIndirectExpr *this_local;
  
  ExprMixin<(wabt::ExprType)41>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)41>,loc);
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__ReturnCallIndirectExpr_002a0f00;
  FuncDeclaration::FuncDeclaration(&this->decl);
  Var::Var(&this->table);
  return;
}

Assistant:

explicit ReturnCallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::ReturnCallIndirect>(loc) {}